

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O2

void __thiscall Fl_Check_Button_Type::ideal_size(Fl_Check_Button_Type *this,int *w,int *h)

{
  Fl_Button_Type::ideal_size(&this->super_Fl_Button_Type,w,h);
  *w = *w + 4;
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Button_Type::ideal_size(w, h);
    w += 4;
  }